

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetCameraResolution
          (VClient *this,string *i_rCameraName,uint *o_rResolutionX,uint *o_rResolutionY)

{
  Enum EVar1;
  bool bVar2;
  VCameraInfo *pVVar3;
  VCameraInfo *pCamera;
  Enum local_44;
  undefined1 local_40 [4];
  Enum GetResult;
  scoped_lock Lock;
  uint *o_rResolutionY_local;
  uint *o_rResolutionX_local;
  string *i_rCameraName_local;
  VClient *this_local;
  
  Lock._8_8_ = o_rResolutionY;
  boost::unique_lock<boost::recursive_mutex>::unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_40,&this->m_FrameMutex);
  local_44 = Success;
  bVar2 = InitGet<unsigned_int,unsigned_int>(this,&local_44,o_rResolutionX,(uint *)Lock._8_8_);
  if ((bVar2) && (pVVar3 = GetCamera(this,i_rCameraName,&local_44), pVVar3 != (VCameraInfo *)0x0)) {
    *o_rResolutionX = pVVar3->m_ResolutionX;
    *(UInt32 *)Lock._8_8_ = pVVar3->m_ResolutionY;
  }
  EVar1 = local_44;
  boost::unique_lock<boost::recursive_mutex>::~unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_40);
  return EVar1;
}

Assistant:

Result::Enum VClient::GetCameraResolution( const std::string & i_rCameraName, unsigned int & o_rResolutionX, unsigned int & o_rResolutionY ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  Result::Enum GetResult = Result::Success;
  if( InitGet( GetResult, o_rResolutionX, o_rResolutionY ) )
  {
    const ViconCGStream::VCameraInfo* pCamera = GetCamera( i_rCameraName, GetResult );
    if( !pCamera )
    {
      return GetResult;
    }

    o_rResolutionX = pCamera->m_ResolutionX;
    o_rResolutionY = pCamera->m_ResolutionY;
  }

  return GetResult;
}